

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.cpp
# Opt level: O0

DEBUG_NB10 * __thiscall DebugDirEntryWrapper::getNB10(DebugDirEntryWrapper *this)

{
  IMAGE_DEBUG_DIRECTORY *pIVar1;
  DEBUG_NB10 *nb;
  IMAGE_DEBUG_DIRECTORY *d;
  BYTE *debugStr;
  DebugDirEntryWrapper *this_local;
  
  this_local = (DebugDirEntryWrapper *)getDebugStruct(this);
  pIVar1 = debugDir(this);
  if ((this_local == (DebugDirEntryWrapper *)0x0) || (pIVar1 == (IMAGE_DEBUG_DIRECTORY *)0x0)) {
    this_local = (DebugDirEntryWrapper *)0x0;
  }
  else if (pIVar1->SizeOfData < 0x11) {
    this_local = (DebugDirEntryWrapper *)0x0;
  }
  else if (*(int *)&(this_local->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
                    super_AbstractByteBuffer._vptr_AbstractByteBuffer != 0x3031424e) {
    this_local = (DebugDirEntryWrapper *)0x0;
  }
  return (DEBUG_NB10 *)this_local;
}

Assistant:

pe::DEBUG_NB10* DebugDirEntryWrapper::getNB10()
{
    BYTE* debugStr = getDebugStruct();
    IMAGE_DEBUG_DIRECTORY* d = debugDir();
    if (!debugStr || !d) return NULL;
    if (d->SizeOfData < sizeof(DEBUG_NB10)) {
        return NULL;
    }
    DEBUG_NB10* nb = (DEBUG_NB10*)debugStr;
    if (nb->cvHdr.CvSignature == CV_SIGNATURE_NB10) {
        return nb;
    }
    return NULL;
}